

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<6>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  unsigned_long uVar1;
  undefined8 in_RAX;
  unsigned_long *puVar2;
  int index;
  RepeatedField<unsigned_long> *array;
  uint32_t local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      index = 0;
      do {
        puVar2 = RepeatedField<unsigned_long>::Get((RepeatedField<unsigned_long> *)field,index);
        uVar1 = *puVar2;
        puVar2 = (unsigned_long *)output->cur_;
        if ((output->impl_).end_ <= puVar2) {
          puVar2 = (unsigned_long *)
                   io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,(uint8_t *)puVar2);
        }
        output->cur_ = (uint8_t *)puVar2;
        *puVar2 = uVar1;
        output->cur_ = (uint8_t *)(puVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}